

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O0

void jpeg_idct_12x12(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined1 *puVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long in_RCX;
  short *in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int ctr;
  JSAMPLE *range_limit;
  JSAMPROW outptr;
  int *wsptr;
  ISLOW_MULT_TYPE *quantptr;
  JCOEFPTR inptr;
  JLONG z4;
  JLONG z3;
  JLONG z2;
  JLONG z1;
  JLONG tmp25;
  JLONG tmp24;
  JLONG tmp23;
  JLONG tmp22;
  JLONG tmp21;
  JLONG tmp20;
  JLONG tmp15;
  JLONG tmp14;
  JLONG tmp13;
  JLONG tmp12;
  JLONG tmp11;
  JLONG tmp10;
  int local_258 [16];
  int local_218 [8];
  int local_1f8 [8];
  int local_1d8 [8];
  int local_1b8 [8];
  int local_198 [8];
  int local_178 [8];
  int local_158 [8];
  int local_138 [8];
  int local_118 [8];
  int local_f8 [9];
  int local_d4;
  long local_d0;
  int *local_c0;
  short *local_b8;
  short *local_b0;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  uint local_24;
  long local_20;
  
  local_d0 = *(long *)(in_RDI + 0x1a8) + 0x80;
  local_b8 = *(short **)(in_RSI + 0x58);
  local_c0 = local_258;
  local_b0 = in_RDX;
  local_24 = in_R8D;
  local_20 = in_RCX;
  for (local_d4 = 0; local_d4 < 8; local_d4 = local_d4 + 1) {
    local_80 = (long)((int)*local_b0 * (int)*local_b8) * 0x2000 + 0x400;
    local_88 = local_80 + (long)((int)local_b0[0x20] * (int)local_b8[0x20]) * 0x2731;
    local_78 = local_80 + (long)((int)local_b0[0x20] * (int)local_b8[0x20]) * -0x2731;
    lVar1 = (long)((int)local_b0[0x10] * (int)local_b8[0x10]);
    lVar2 = (long)((int)local_b0[0x30] * (int)local_b8[0x30]);
    lVar3 = lVar1 * 0x2000 + lVar2 * -0x2000;
    local_68 = local_80 + lVar3;
    local_80 = local_80 - lVar3;
    lVar3 = lVar1 * 0x2bb6 + lVar2 * 0x2000;
    local_60 = local_88 + lVar3;
    local_88 = local_88 - lVar3;
    lVar1 = lVar1 * 0xbb6 + lVar2 * -0x2000;
    local_70 = local_78 + lVar1;
    local_78 = local_78 - lVar1;
    lVar1 = (long)((int)local_b0[8] * (int)local_b8[8]);
    lVar2 = (long)((int)local_b0[0x18] * (int)local_b8[0x18]);
    lVar3 = (long)((int)local_b0[0x28] * (int)local_b8[0x28]);
    lVar4 = (long)((int)local_b0[0x38] * (int)local_b8[0x38]);
    local_58 = (lVar1 + lVar3 + lVar4) * 0x1b8d;
    local_40 = local_58 + (lVar1 + lVar3) * 0x85b;
    local_30 = local_40 + lVar2 * 0x29cf + lVar1 * 0x8f7;
    local_48 = (lVar3 + lVar4) * -0x2175;
    local_40 = local_48 + lVar2 * -0x1151 + lVar3 * -0x2f50 + local_40;
    local_48 = local_58 + lVar2 * -0x29cf + lVar4 * 0x32c6 + local_48;
    local_58 = lVar2 * -0x1151 + lVar1 * -0x15a4 + lVar4 * -0x3f74 + local_58;
    local_50 = ((lVar1 - lVar4) + (lVar2 - lVar3)) * 0x1151;
    local_38 = local_50 + (lVar1 - lVar4) * 0x187e;
    local_50 = local_50 + (lVar2 - lVar3) * -0x3b21;
    *local_c0 = (int)(local_60 + local_30 >> 0xb);
    local_c0[0x58] = (int)(local_60 - local_30 >> 0xb);
    local_c0[8] = (int)(local_68 + local_38 >> 0xb);
    local_c0[0x50] = (int)(local_68 - local_38 >> 0xb);
    local_c0[0x10] = (int)(local_70 + local_40 >> 0xb);
    local_c0[0x48] = (int)(local_70 - local_40 >> 0xb);
    local_c0[0x18] = (int)(local_78 + local_48 >> 0xb);
    local_c0[0x40] = (int)(local_78 - local_48 >> 0xb);
    local_c0[0x20] = (int)(local_80 + local_50 >> 0xb);
    local_c0[0x38] = (int)(local_80 - local_50 >> 0xb);
    local_c0[0x28] = (int)(local_88 + local_58 >> 0xb);
    local_c0[0x30] = (int)(local_88 - local_58 >> 0xb);
    local_b0 = local_b0 + 1;
    local_b8 = local_b8 + 1;
    local_c0 = local_c0 + 1;
  }
  local_c0 = local_258;
  for (local_d4 = 0; local_d4 < 0xc; local_d4 = local_d4 + 1) {
    puVar5 = (undefined1 *)(*(long *)(local_20 + (long)local_d4 * 8) + (ulong)local_24);
    lVar6 = ((long)*local_c0 + 0x10) * 0x2000;
    lVar7 = lVar6 + (long)local_c0[4] * 0x2731;
    lVar8 = lVar6 + (long)local_c0[4] * -0x2731;
    lVar1 = (long)local_c0[2];
    lVar2 = (long)local_c0[6];
    lVar3 = lVar1 * 0x2000 + lVar2 * -0x2000;
    lVar4 = lVar6 + lVar3;
    lVar6 = lVar6 - lVar3;
    lVar3 = lVar1 * 0x2bb6 + lVar2 * 0x2000;
    lVar9 = lVar7 + lVar3;
    lVar7 = lVar7 - lVar3;
    lVar1 = lVar1 * 0xbb6 + lVar2 * -0x2000;
    lVar2 = lVar8 + lVar1;
    lVar8 = lVar8 - lVar1;
    lVar1 = (long)local_c0[1];
    lVar3 = (long)local_c0[3];
    lVar10 = (long)local_c0[5];
    lVar11 = (long)local_c0[7];
    lVar12 = (lVar1 + lVar10 + lVar11) * 0x1b8d;
    lVar13 = lVar12 + (lVar1 + lVar10) * 0x85b;
    lVar14 = lVar13 + lVar3 * 0x29cf + lVar1 * 0x8f7;
    lVar15 = (lVar10 + lVar11) * -0x2175;
    lVar13 = lVar15 + lVar3 * -0x1151 + lVar10 * -0x2f50 + lVar13;
    lVar15 = lVar12 + lVar3 * -0x29cf + lVar11 * 0x32c6 + lVar15;
    lVar12 = lVar3 * -0x1151 + lVar1 * -0x15a4 + lVar11 * -0x3f74 + lVar12;
    lVar16 = ((lVar1 - lVar11) + (lVar3 - lVar10)) * 0x1151;
    lVar1 = lVar16 + (lVar1 - lVar11) * 0x187e;
    lVar16 = lVar16 + (lVar3 - lVar10) * -0x3b21;
    *puVar5 = *(undefined1 *)(local_d0 + (int)((uint)(lVar9 + lVar14 >> 0x12) & 0x3ff));
    puVar5[0xb] = *(undefined1 *)(local_d0 + (int)((uint)(lVar9 - lVar14 >> 0x12) & 0x3ff));
    puVar5[1] = *(undefined1 *)(local_d0 + (int)((uint)(lVar4 + lVar1 >> 0x12) & 0x3ff));
    puVar5[10] = *(undefined1 *)(local_d0 + (int)((uint)(lVar4 - lVar1 >> 0x12) & 0x3ff));
    puVar5[2] = *(undefined1 *)(local_d0 + (int)((uint)(lVar2 + lVar13 >> 0x12) & 0x3ff));
    puVar5[9] = *(undefined1 *)(local_d0 + (int)((uint)(lVar2 - lVar13 >> 0x12) & 0x3ff));
    puVar5[3] = *(undefined1 *)(local_d0 + (int)((uint)(lVar8 + lVar15 >> 0x12) & 0x3ff));
    puVar5[8] = *(undefined1 *)(local_d0 + (int)((uint)(lVar8 - lVar15 >> 0x12) & 0x3ff));
    puVar5[4] = *(undefined1 *)(local_d0 + (int)((uint)(lVar6 + lVar16 >> 0x12) & 0x3ff));
    puVar5[7] = *(undefined1 *)(local_d0 + (int)((uint)(lVar6 - lVar16 >> 0x12) & 0x3ff));
    puVar5[5] = *(undefined1 *)(local_d0 + (int)((uint)(lVar7 + lVar12 >> 0x12) & 0x3ff));
    puVar5[6] = *(undefined1 *)(local_d0 + (int)((uint)(lVar7 - lVar12 >> 0x12) & 0x3ff));
    local_c0 = local_c0 + 8;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_12x12(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  JLONG tmp10, tmp11, tmp12, tmp13, tmp14, tmp15;
  JLONG tmp20, tmp21, tmp22, tmp23, tmp24, tmp25;
  JLONG z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8 * 12];        /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    z3 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    z3 = LEFT_SHIFT(z3, CONST_BITS);
    /* Add fudge factor here for final descale. */
    z3 += ONE << (CONST_BITS - PASS1_BITS - 1);

    z4 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    z4 = MULTIPLY(z4, FIX(1.224744871)); /* c4 */

    tmp10 = z3 + z4;
    tmp11 = z3 - z4;

    z1 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z4 = MULTIPLY(z1, FIX(1.366025404)); /* c2 */
    z1 = LEFT_SHIFT(z1, CONST_BITS);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);
    z2 = LEFT_SHIFT(z2, CONST_BITS);

    tmp12 = z1 - z2;

    tmp21 = z3 + tmp12;
    tmp24 = z3 - tmp12;

    tmp12 = z4 + z2;

    tmp20 = tmp10 + tmp12;
    tmp25 = tmp10 - tmp12;

    tmp12 = z4 - z1 - z2;

    tmp22 = tmp11 + tmp12;
    tmp23 = tmp11 - tmp12;

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);

    tmp11 = MULTIPLY(z2, FIX(1.306562965));                  /* c3 */
    tmp14 = MULTIPLY(z2, -FIX_0_541196100);                  /* -c9 */

    tmp10 = z1 + z3;
    tmp15 = MULTIPLY(tmp10 + z4, FIX(0.860918669));          /* c7 */
    tmp12 = tmp15 + MULTIPLY(tmp10, FIX(0.261052384));       /* c5-c7 */
    tmp10 = tmp12 + tmp11 + MULTIPLY(z1, FIX(0.280143716));  /* c1-c5 */
    tmp13 = MULTIPLY(z3 + z4, -FIX(1.045510580));            /* -(c7+c11) */
    tmp12 += tmp13 + tmp14 - MULTIPLY(z3, FIX(1.478575242)); /* c1+c5-c7-c11 */
    tmp13 += tmp15 - tmp11 + MULTIPLY(z4, FIX(1.586706681)); /* c1+c11 */
    tmp15 += tmp14 - MULTIPLY(z1, FIX(0.676326758)) -        /* c7-c11 */
             MULTIPLY(z4, FIX(1.982889723));                 /* c5+c7 */

    z1 -= z4;
    z2 -= z3;
    z3 = MULTIPLY(z1 + z2, FIX_0_541196100);                 /* c9 */
    tmp11 = z3 + MULTIPLY(z1, FIX_0_765366865);              /* c3-c9 */
    tmp14 = z3 - MULTIPLY(z2, FIX_1_847759065);              /* c3+c9 */

    /* Final output stage */

    wsptr[8 * 0]  = (int)RIGHT_SHIFT(tmp20 + tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 11] = (int)RIGHT_SHIFT(tmp20 - tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 1]  = (int)RIGHT_SHIFT(tmp21 + tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 10] = (int)RIGHT_SHIFT(tmp21 - tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 2]  = (int)RIGHT_SHIFT(tmp22 + tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 9]  = (int)RIGHT_SHIFT(tmp22 - tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 3]  = (int)RIGHT_SHIFT(tmp23 + tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 8]  = (int)RIGHT_SHIFT(tmp23 - tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 4]  = (int)RIGHT_SHIFT(tmp24 + tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 7]  = (int)RIGHT_SHIFT(tmp24 - tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 5]  = (int)RIGHT_SHIFT(tmp25 + tmp15, CONST_BITS - PASS1_BITS);
    wsptr[8 * 6]  = (int)RIGHT_SHIFT(tmp25 - tmp15, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 12 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 12; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    z3 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    z3 = LEFT_SHIFT(z3, CONST_BITS);

    z4 = (JLONG)wsptr[4];
    z4 = MULTIPLY(z4, FIX(1.224744871)); /* c4 */

    tmp10 = z3 + z4;
    tmp11 = z3 - z4;

    z1 = (JLONG)wsptr[2];
    z4 = MULTIPLY(z1, FIX(1.366025404)); /* c2 */
    z1 = LEFT_SHIFT(z1, CONST_BITS);
    z2 = (JLONG)wsptr[6];
    z2 = LEFT_SHIFT(z2, CONST_BITS);

    tmp12 = z1 - z2;

    tmp21 = z3 + tmp12;
    tmp24 = z3 - tmp12;

    tmp12 = z4 + z2;

    tmp20 = tmp10 + tmp12;
    tmp25 = tmp10 - tmp12;

    tmp12 = z4 - z1 - z2;

    tmp22 = tmp11 + tmp12;
    tmp23 = tmp11 - tmp12;

    /* Odd part */

    z1 = (JLONG)wsptr[1];
    z2 = (JLONG)wsptr[3];
    z3 = (JLONG)wsptr[5];
    z4 = (JLONG)wsptr[7];

    tmp11 = MULTIPLY(z2, FIX(1.306562965));                  /* c3 */
    tmp14 = MULTIPLY(z2, -FIX_0_541196100);                  /* -c9 */

    tmp10 = z1 + z3;
    tmp15 = MULTIPLY(tmp10 + z4, FIX(0.860918669));          /* c7 */
    tmp12 = tmp15 + MULTIPLY(tmp10, FIX(0.261052384));       /* c5-c7 */
    tmp10 = tmp12 + tmp11 + MULTIPLY(z1, FIX(0.280143716));  /* c1-c5 */
    tmp13 = MULTIPLY(z3 + z4, -FIX(1.045510580));            /* -(c7+c11) */
    tmp12 += tmp13 + tmp14 - MULTIPLY(z3, FIX(1.478575242)); /* c1+c5-c7-c11 */
    tmp13 += tmp15 - tmp11 + MULTIPLY(z4, FIX(1.586706681)); /* c1+c11 */
    tmp15 += tmp14 - MULTIPLY(z1, FIX(0.676326758)) -        /* c7-c11 */
             MULTIPLY(z4, FIX(1.982889723));                 /* c5+c7 */

    z1 -= z4;
    z2 -= z3;
    z3 = MULTIPLY(z1 + z2, FIX_0_541196100);                 /* c9 */
    tmp11 = z3 + MULTIPLY(z1, FIX_0_765366865);              /* c3-c9 */
    tmp14 = z3 - MULTIPLY(z2, FIX_1_847759065);              /* c3+c9 */

    /* Final output stage */

    outptr[0]  = range_limit[(int)RIGHT_SHIFT(tmp20 + tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[11] = range_limit[(int)RIGHT_SHIFT(tmp20 - tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[1]  = range_limit[(int)RIGHT_SHIFT(tmp21 + tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[10] = range_limit[(int)RIGHT_SHIFT(tmp21 - tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[2]  = range_limit[(int)RIGHT_SHIFT(tmp22 + tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[9]  = range_limit[(int)RIGHT_SHIFT(tmp22 - tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[3]  = range_limit[(int)RIGHT_SHIFT(tmp23 + tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[8]  = range_limit[(int)RIGHT_SHIFT(tmp23 - tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[4]  = range_limit[(int)RIGHT_SHIFT(tmp24 + tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[7]  = range_limit[(int)RIGHT_SHIFT(tmp24 - tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[5]  = range_limit[(int)RIGHT_SHIFT(tmp25 + tmp15,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[6]  = range_limit[(int)RIGHT_SHIFT(tmp25 - tmp15,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];

    wsptr += 8;         /* advance pointer to next row */
  }
}